

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O2

void store_redraw(store_context *ctx)

{
  _Bool _Var1;
  uint uVar2;
  store *store;
  owner *poVar3;
  _Bool _Var4;
  wchar_t wVar5;
  size_t sVar6;
  wchar_t col;
  char *pcVar7;
  char acStack_88 [88];
  
  wVar5 = ctx->flags;
  if ((wVar5 & 2U) != 0) {
    store = ctx->store;
    poVar3 = store->owner;
    Term_clear();
    _Var4 = store_is_home(store);
    if (_Var4) {
      put_str("Your Home",ctx->scr_places_y[1],L'\x01');
      put_str("Home Inventory",ctx->scr_places_y[2],L'\x01');
      wVar5 = ctx->scr_places_y[2];
      col = ctx->scr_places_x[7] + L'\x02';
      pcVar7 = "Weight";
    }
    else {
      pcVar7 = store->name;
      strnfmt(acStack_88,0x50,"%s (%s)",poVar3->name,poVar3->race->name);
      put_str(acStack_88,ctx->scr_places_y[1],L'\x01');
      strnfmt(acStack_88,0x50,"%s (%ld)",pcVar7,(long)poVar3->max_cost);
      uVar2 = ctx->scr_places_x[1];
      wVar5 = ctx->scr_places_y[1];
      sVar6 = strlen(acStack_88);
      prt(acStack_88,wVar5,uVar2 - (int)sVar6);
      put_str("Store Inventory",ctx->scr_places_y[2],L'\x01');
      put_str("Weight",ctx->scr_places_y[2],ctx->scr_places_x[7] + L'\x02');
      wVar5 = ctx->scr_places_y[2];
      col = ctx->scr_places_x[0] + L'\x04';
      pcVar7 = "Price";
    }
    put_str(pcVar7,wVar5,col);
    if ((ctx->flags & L'\x04') == L'\0') {
      prt("Press \'?\' for help.",ctx->scr_places_y[5],L'\x01');
    }
    else {
      wVar5 = ctx->scr_places_y[5];
      _Var4 = store_is_home(ctx->store);
      clear_from(ctx->scr_places_y[4]);
      text_out_hook = text_out_to_screen;
      text_out_indent = L'\x01';
      Term_gotoxy(L'\x01',wVar5);
      pcVar7 = "l";
      if ((player->opts).opt[1] != false) {
        pcVar7 = "x";
      }
      text_out_c('\r',pcVar7);
      text_out(" examines");
      if (ctx->inspect_only == false) {
        text_out(" and ");
        text_out_c('\r',"p");
        text_out(" (or ");
        text_out_c('\r',"g");
        text_out(")");
        pcVar7 = " purchases";
        if (_Var4) {
          pcVar7 = " picks up";
        }
        text_out(pcVar7);
      }
      text_out(" an item. ");
      if (ctx->inspect_only == false) {
        _Var1 = (player->opts).opt[0x25];
        text_out_c('\r',"d");
        text_out(" (or ");
        text_out_c('\r',"s");
        text_out(")");
        if ((~_Var1 & 1U) == 0 && !_Var4) {
          pcVar7 = 
          " gives an item to the store in return for its identification. Some wands and staves will also be recharged. "
          ;
        }
        else {
          pcVar7 = " sells";
          if (_Var4) {
            pcVar7 = " drops";
          }
          text_out(pcVar7);
          pcVar7 = " an item from your inventory. ";
        }
        text_out(pcVar7);
      }
      text_out_c('\r',"I");
      text_out(" inspects an item from your inventory. ");
      text_out_c('\r',"ESC");
      pcVar7 = " exits the building.";
      if (ctx->inspect_only != false) {
        pcVar7 = " exits this screen.";
      }
      text_out(pcVar7);
      text_out_indent = L'\0';
    }
    wVar5 = ctx->flags & 0xfffffffd;
    ctx->flags = wVar5;
  }
  if ((wVar5 & 1U) != 0) {
    pcVar7 = format("Gold Remaining: %9ld",(long)player->au);
    prt(pcVar7,ctx->scr_places_y[6],ctx->scr_places_x[6]);
    *(byte *)&ctx->flags = (byte)ctx->flags & 0xfe;
  }
  return;
}

Assistant:

static void store_redraw(struct store_context *ctx)
{
	if (ctx->flags & (STORE_FRAME_CHANGE)) {
		store_display_frame(ctx);

		if (ctx->flags & STORE_SHOW_HELP)
			store_display_help(ctx);
		else
			prt("Press '?' for help.", ctx->scr_places_y[LOC_HELP_PROMPT], 1);

		ctx->flags &= ~(STORE_FRAME_CHANGE);
	}

	if (ctx->flags & (STORE_GOLD_CHANGE)) {
		prt(format("Gold Remaining: %9ld", (long)player->au),
				ctx->scr_places_y[LOC_AU], ctx->scr_places_x[LOC_AU]);
		ctx->flags &= ~(STORE_GOLD_CHANGE);
	}
}